

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeGravityForceScale(ChElementHexaANCF_3813 *this)

{
  double dVar1;
  undefined1 auVar2 [64];
  BrickGravity myformula1;
  BrickGravity BStack_400;
  
  BrickGravity::BrickGravity(&BStack_400,&this->m_d0,this);
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  ChQuadrature::Integrate3D<Eigen::Matrix<double,8,1,0,8,1>>
            (&this->m_GravForceScale,
             &BStack_400.super_ChIntegrable3D<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,-1.0,1.0,-1.0,
             1.0,-1.0,1.0,2);
  dVar1 = (((this->m_Material).
            super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->super_ChContinuumMaterial).density;
  auVar2._8_8_ = dVar1;
  auVar2._0_8_ = dVar1;
  auVar2._16_8_ = dVar1;
  auVar2._24_8_ = dVar1;
  auVar2._32_8_ = dVar1;
  auVar2._40_8_ = dVar1;
  auVar2._48_8_ = dVar1;
  auVar2._56_8_ = dVar1;
  auVar2 = vmulpd_avx512f(*(undefined1 (*) [64])
                           (this->m_GravForceScale).
                           super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
                           m_data.array,auVar2);
  *(undefined1 (*) [64])
   (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
   m_data.array = auVar2;
  return;
}

Assistant:

void ChElementHexaANCF_3813::ComputeGravityForceScale() {
    BrickGravity myformula1(&m_d0, this);
    m_GravForceScale.setZero();
    ChQuadrature::Integrate3D<ChVectorN<double, 8>>(m_GravForceScale,  // result of integration will go there
                                                    myformula1,        // formula to integrate
                                                    -1, 1,             // limits in x direction
                                                    -1, 1,             // limits in y direction
                                                    -1, 1,             // limits in z direction
                                                    2                  // order of integration
    );

    m_GravForceScale *= m_Material->Get_density();
}